

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSIMDReplace(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef vec,uint8_t index,
                   BinaryenExpressionRef value)

{
  SIMDReplace *pSVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pSVar1 = wasm::Builder::makeSIMDReplace(&local_10,op,vec,index,value);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDReplace(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef vec,
                                          uint8_t index,
                                          BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDReplace(
        SIMDReplaceOp(op), (Expression*)vec, index, (Expression*)value));
}